

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O1

LONG CorUnix::CPalSynchronizationManager::ResetSharedSynchLock(CPalThread *pthrCurrent)

{
  int iVar1;
  
  iVar1 = (pthrCurrent->synchronizationInfo).m_lSharedSynchLockCount.m_val;
  if (iVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","ResetSharedSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x2b2);
    fprintf(_stderr,"Expression: 0 <= lRet\n");
  }
  if ((iVar1 != 0) && ((pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val < 1)) {
    fprintf(_stderr,"] %s %s:%d","ResetSharedSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x2b4);
    fprintf(_stderr,
            "Expression: 0 == lRet || 0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount\n"
           );
  }
  if (0 < iVar1) {
    (pthrCurrent->synchronizationInfo).m_lSharedSynchLockCount.m_val = 0;
    SHMRelease();
  }
  return iVar1;
}

Assistant:

static LONG ResetSharedSynchLock(CPalThread * pthrCurrent) 
        {   
            LONG lRet = pthrCurrent->synchronizationInfo.m_lSharedSynchLockCount;

            _ASSERTE(0 <= lRet);
            _ASSERTE(0 == lRet || 
                     0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount);
            if (0 < lRet)
            {
                pthrCurrent->synchronizationInfo.m_lSharedSynchLockCount = 0;
                SHMRelease();
            }
            return lRet;
        }